

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc.cpp
# Opt level: O3

void __thiscall GcHeap::GcHeapImpl::~GcHeapImpl(GcHeapImpl *this)

{
  _List_node_base *p_Var1;
  pointer ppSVar2;
  _List_node_base *p_Var3;
  
  munmap(this->heap_start,this->number_of_pages << 0xc);
  p_Var3 = (this->finalize_queue).super__List_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl._M_node.
           super__List_node_base._M_next;
  while (p_Var3 != (_List_node_base *)&this->finalize_queue) {
    p_Var1 = p_Var3->_M_next;
    operator_delete(p_Var3,0x18);
    p_Var3 = p_Var1;
  }
  ppSVar2 = (this->worklist).super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppSVar2 != (pointer)0x0) {
    operator_delete(ppSVar2,(long)(this->worklist).
                                  super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage - (long)ppSVar2);
  }
  std::
  _Hashtable<Sexp_*,_std::pair<Sexp_*const,_Sexp_*>,_std::allocator<std::pair<Sexp_*const,_Sexp_*>_>,_std::__detail::_Select1st,_std::equal_to<Sexp_*>,_std::hash<Sexp_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->forwarding_addresses)._M_h);
  return;
}

Assistant:

~GcHeapImpl() { UnmapTheHeap(heap_start, PAGE_SIZE * number_of_pages); }